

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

void __thiscall setup::registry_entry::load(registry_entry *this,istream *is,info *i)

{
  uint16_t uVar1;
  short sVar2;
  uint uVar3;
  enum_type eVar4;
  enum_type eVar5;
  enum_type eVar6;
  flag_type fVar7;
  int_adapter<unsigned_int> *in_RDX;
  info *in_RSI;
  istream *in_RDI;
  item *unaff_retaddr;
  stored_flag_reader<flags<setup::registry_entry::flags_Enum_,_12UL>_> flagreader;
  stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_2> *in_stack_000000d8;
  istream *in_stack_ffffffffffffff28;
  info *is_00;
  info *in_stack_ffffffffffffff30;
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_58 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_50 [8];
  encoded_string local_48;
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  istream *is_01;
  
  local_18 = in_RDX;
  is_01 = in_RDI;
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x1030000) {
    util::load<unsigned_int>((istream *)0x188c1d);
  }
  util::encoded_string::encoded_string
            (&local_30,(string *)&in_RDI->field_0x100,local_18[6].value_,
             (bitset<256UL> *)(local_18 + 0x138));
  util::operator>>((istream *)in_stack_ffffffffffffff30,(encoded_string *)in_stack_ffffffffffffff28)
  ;
  uVar1 = setup::version::bits(&in_stack_ffffffffffffff30->version);
  if (uVar1 == 0x10) {
    std::__cxx11::string::clear();
  }
  else {
    util::encoded_string::encoded_string
              (&local_48,(string *)&in_RDI[1]._M_gcount,local_18[6].value_);
    util::operator>>((istream *)in_stack_ffffffffffffff30,
                     (encoded_string *)in_stack_ffffffffffffff28);
  }
  boost::unordered::iterator_detail::
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
            (local_50,(slice_reader *)&in_RDI[1].field_0x28);
  util::operator>>((istream *)in_stack_ffffffffffffff30,(binary_string *)in_stack_ffffffffffffff28);
  item::load_condition_data(unaff_retaddr,is_01,in_RSI);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  is_00 = in_RSI;
  if ((uVar3 < 0x4000b00) ||
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), is_00 = in_RSI,
     0x400ffff < uVar3)) {
    in_RSI = in_stack_ffffffffffffff30;
    std::__cxx11::string::clear();
  }
  else {
    boost::unordered::iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
              (local_58,(slice_reader *)&in_RDI[1].field_0x48);
    util::operator>>((istream *)in_RSI,(binary_string *)in_stack_ffffffffffffff28);
  }
  item::load_version_data((item *)in_RSI,in_stack_ffffffffffffff28,(version *)0x188dbd);
  uVar1 = setup::version::bits(&in_RSI->version);
  if (uVar1 == 0x10) {
    *(undefined4 *)&in_RDI[1].field_0x68 = 7;
  }
  else {
    uVar3 = util::load<unsigned_int>((istream *)0x188ddf);
    *(uint *)&in_RDI[1].field_0x68 = uVar3 & 0x7fffffff;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4010000) {
    *(undefined4 *)&in_RDI[1].field_0x6c = 0xffffffff;
  }
  else {
    sVar2 = util::load<short>((istream *)0x188e24);
    *(int *)&in_RDI[1].field_0x6c = (int)sVar2;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x5020500) {
    uVar1 = setup::version::bits(&in_RSI->version);
    if (uVar1 == 0x10) {
      stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_0>::stored_enum
                ((stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_0> *)in_RSI,
                 in_stack_ffffffffffffff28);
      eVar6 = stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_0>::get
                        ((stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_0> *)
                         in_stack_000000d8);
      *(enum_type *)&in_RDI[1].field_0x70 = eVar6;
    }
    else {
      stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_1>::stored_enum
                ((stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_1> *)in_RSI,
                 in_stack_ffffffffffffff28);
      eVar5 = stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_1>::get
                        ((stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_1> *)
                         in_stack_000000d8);
      *(enum_type *)&in_RDI[1].field_0x70 = eVar5;
    }
  }
  else {
    stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_2>::stored_enum
              ((stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_2> *)in_RSI,
               in_stack_ffffffffffffff28);
    eVar4 = stored_enum<setup::(anonymous_namespace)::stored_registry_entry_type_2>::get
                      (in_stack_000000d8);
    *(enum_type *)&in_RDI[1].field_0x70 = eVar4;
  }
  setup::version::bits(&in_RSI->version);
  stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_>::stored_flag_reader
            ((stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_> *)in_RSI,
             (istream *)is_00,0x188f1c);
  uVar1 = setup::version::bits(&in_RSI->version);
  if (uVar1 != 0x10) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
  }
  stored_flag_reader<setup::registry_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
             (enum_type)((ulong)is_00 >> 0x20));
  stored_flag_reader<setup::registry_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
             (enum_type)((ulong)is_00 >> 0x20));
  stored_flag_reader<setup::registry_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
             (enum_type)((ulong)is_00 >> 0x20));
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x10205ff < uVar3) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x10308ff < uVar3) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x1030bff < uVar3) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x1030fff < uVar3) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x500ffff < uVar3) {
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
    stored_flag_reader<setup::registry_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::registry_entry::flags_Enum_> *)in_RSI,
               (enum_type)((ulong)is_00 >> 0x20));
  }
  fVar7 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)is_00);
  *(Type *)&in_RDI[1].field_0x78 = fVar7._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void registry_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(key, i.codepage, i.header.lead_bytes);
	if(i.version.bits() != 16) {
		is >> util::encoded_string(name, i.codepage);
	} else {
		name.clear();
	}
	is >> util::binary_string(value);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(4, 0, 11) && i.version < INNO_VERSION(4, 1, 0)) {
		is >> util::binary_string(permissions);
	} else {
		permissions.clear();
	}
	
	load_version_data(is, i.version);
	
	if(i.version.bits() != 16) {
		hive = hive_name(util::load<boost::uint32_t>(is) & ~0x80000000);
	} else {
		hive = Unset;
	}
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		permission = util::load<boost::int16_t>(is);
	} else {
		permission = -1;
	}
	
	if(i.version >= INNO_VERSION(5, 2, 5)) {
		type = stored_enum<stored_registry_entry_type_2>(is).get();
	} else if(i.version.bits() != 16) {
		type = stored_enum<stored_registry_entry_type_1>(is).get();
	} else {
		type = stored_enum<stored_registry_entry_type_0>(is).get();
	}
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	if(i.version.bits() != 16) {
		flagreader.add(CreateValueIfDoesntExist);
		flagreader.add(UninsDeleteValue);
	}
	flagreader.add(UninsClearValue);
	flagreader.add(UninsDeleteEntireKey);
	flagreader.add(UninsDeleteEntireKeyIfEmpty);
	if(i.version >= INNO_VERSION(1, 2, 6)) {
		flagreader.add(PreserveStringType);
	}
	if(i.version >= INNO_VERSION(1, 3, 9)) {
		flagreader.add(DeleteKey);
		flagreader.add(DeleteValue);
	}
	if(i.version >= INNO_VERSION(1, 3, 12)) {
		flagreader.add(NoError);
	}
	if(i.version >= INNO_VERSION(1, 3, 16)) {
		flagreader.add(DontCreateKey);
	}
	if(i.version >= INNO_VERSION(5, 1, 0)) {
		flagreader.add(Bits32);
		flagreader.add(Bits64);
	}
	
	options = flagreader.finalize();
}